

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strcat_63(UChar *dst,UChar *src)

{
  UChar UVar1;
  UChar *anchor;
  UChar *src_local;
  UChar *dst_local;
  
  for (src_local = dst; anchor = src, *src_local != L'\0'; src_local = src_local + 1) {
  }
  do {
    UVar1 = *anchor;
    *src_local = UVar1;
    anchor = anchor + 1;
    src_local = src_local + 1;
  } while (UVar1 != L'\0');
  return dst;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strcat(UChar     *dst, 
    const UChar     *src)
{
    UChar *anchor = dst;            /* save a pointer to start of dst */

    while(*dst != 0) {              /* To end of first string          */
        ++dst;
    }
    while((*(dst++) = *(src++)) != 0) {     /* copy string 2 over              */
    }

    return anchor;
}